

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  void *pvVar1;
  char *pcVar2;
  secp256k1_ecdsa_recoverable_signature *in_R8;
  int recid;
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
            ,0x4e,"test condition failed: ctx != NULL");
    abort();
  }
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "sig != NULL";
  }
  else {
    if (sigin != (secp256k1_ecdsa_recoverable_signature *)0x0) {
      secp256k1_ecdsa_recoverable_signature_load
                ((secp256k1_context *)&r,&s,(secp256k1_scalar *)&recid,(int *)sigin,in_R8);
      secp256k1_ecdsa_signature_save(sig,&r,&s);
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "sigin != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}